

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCustomCommandGenerator.cxx
# Opt level: O2

void __thiscall
cmCustomCommandGenerator::AppendArguments(cmCustomCommandGenerator *this,uint c,string *cmd)

{
  bool bVar1;
  cmLocalGenerator *pcVar2;
  size_t sVar3;
  _Alloc_hider _Var4;
  size_type sVar5;
  bool bVar6;
  char *pcVar7;
  pointer pcVar8;
  ulong uVar9;
  ulong uVar10;
  string_view str;
  string_view str_00;
  string arg;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  emulator;
  string local_50;
  
  GetCrossCompilingEmulator_abi_cxx11_(&emulator,this,c);
  if (emulator.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      emulator.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    uVar9 = 1;
  }
  else {
    uVar9 = 0;
    for (uVar10 = 1;
        uVar10 < (ulong)((long)emulator.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)emulator.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start >> 5);
        uVar10 = (ulong)((int)uVar10 + 1)) {
      std::__cxx11::string::append((char *)cmd);
      if (this->OldStyle == true) {
        escapeForShellOldStyle
                  (&arg,emulator.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + uVar10);
        std::__cxx11::string::append((string *)cmd);
      }
      else {
        pcVar2 = this->LG;
        pcVar7 = emulator.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar10]._M_dataplus._M_p;
        sVar3 = emulator.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start[uVar10]._M_string_length;
        bVar1 = this->MakeVars;
        if (bVar1 == true) {
          bVar6 = cmLocalGenerator::IsNinjaMulti(pcVar2);
        }
        else {
          bVar6 = false;
        }
        str._M_str = pcVar7;
        str._M_len = sVar3;
        cmOutputConverter::EscapeForShell_abi_cxx11_
                  (&arg,&pcVar2->super_cmOutputConverter,str,bVar1,false,false,bVar6,false);
        std::__cxx11::string::append((string *)cmd);
      }
      std::__cxx11::string::~string((string *)&arg);
    }
  }
  pcVar8 = (this->CommandLines).
           super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
           super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>._M_impl.
           super__Vector_impl_data._M_start + c;
  for (; uVar9 < (ulong)((long)*(pointer *)
                                ((long)&(pcVar8->
                                        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ).
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                + 8) -
                         *(long *)&(pcVar8->
                                   super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ).
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        >> 5); uVar9 = (ulong)((int)uVar9 + 1)) {
    arg._M_dataplus._M_p = (pointer)&arg.field_2;
    arg._M_string_length = 0;
    arg.field_2._M_local_buf[0] = '\0';
    if ((uVar9 == 0) && (pcVar7 = GetArgv0Location(this,c), pcVar7 != (char *)0x0)) {
      std::__cxx11::string::assign((char *)&arg);
    }
    else {
      std::__cxx11::string::_M_assign((string *)&arg);
    }
    std::__cxx11::string::append((char *)cmd);
    sVar5 = arg._M_string_length;
    _Var4 = arg._M_dataplus;
    if (this->OldStyle == true) {
      escapeForShellOldStyle(&local_50,&arg);
      std::__cxx11::string::append((string *)cmd);
    }
    else {
      pcVar2 = this->LG;
      bVar1 = this->MakeVars;
      if (bVar1 == true) {
        bVar6 = cmLocalGenerator::IsNinjaMulti(pcVar2);
      }
      else {
        bVar6 = false;
      }
      str_00._M_str = _Var4._M_p;
      str_00._M_len = sVar5;
      cmOutputConverter::EscapeForShell_abi_cxx11_
                (&local_50,&pcVar2->super_cmOutputConverter,str_00,bVar1,false,false,bVar6,false);
      std::__cxx11::string::append((string *)cmd);
    }
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&arg);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&emulator);
  return;
}

Assistant:

void cmCustomCommandGenerator::AppendArguments(unsigned int c,
                                               std::string& cmd) const
{
  unsigned int offset = 1;
  std::vector<std::string> emulator = this->GetCrossCompilingEmulator(c);
  if (!emulator.empty()) {
    for (unsigned j = 1; j < emulator.size(); ++j) {
      cmd += " ";
      if (this->OldStyle) {
        cmd += escapeForShellOldStyle(emulator[j]);
      } else {
        cmd +=
          this->LG->EscapeForShell(emulator[j], this->MakeVars, false, false,
                                   this->MakeVars && this->LG->IsNinjaMulti());
      }
    }

    offset = 0;
  }

  cmCustomCommandLine const& commandLine = this->CommandLines[c];
  for (unsigned int j = offset; j < commandLine.size(); ++j) {
    std::string arg;
    if (const char* location = j == 0 ? this->GetArgv0Location(c) : nullptr) {
      // GetCommand returned the emulator instead of the argv0 location,
      // so transform the latter now.
      arg = location;
    } else {
      arg = commandLine[j];
    }
    cmd += " ";
    if (this->OldStyle) {
      cmd += escapeForShellOldStyle(arg);
    } else {
      cmd +=
        this->LG->EscapeForShell(arg, this->MakeVars, false, false,
                                 this->MakeVars && this->LG->IsNinjaMulti());
    }
  }
}